

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileChangeHandler.cpp
# Opt level: O3

void __thiscall
FileChangeHandler::registerCapabilities(FileChangeHandler *this,ServerCapabilities *capabilities)

{
  if ((capabilities->textDocumentSync).is_some == false) {
    (capabilities->textDocumentSync).value.save.value.includeText = false;
    (capabilities->textDocumentSync).value.save.is_some = false;
    (capabilities->textDocumentSync).value.openClose = false;
    *(undefined3 *)&(capabilities->textDocumentSync).value.field_0x9 = 0;
    (capabilities->textDocumentSync).value.change = None;
    (capabilities->textDocumentSync).is_some = true;
  }
  (capabilities->textDocumentSync).value.openClose = true;
  (capabilities->textDocumentSync).value.change = Incremental;
  (capabilities->textDocumentSync).value.willSave = true;
  (capabilities->textDocumentSync).value.willSaveWaitUntil = false;
  return;
}

Assistant:

void FileChangeHandler::registerCapabilities (Init::ServerCapabilities &capabilities) {
    if (!capabilities.textDocumentSync) capabilities.textDocumentSync = Init::TextDocumentSyncOptions {};
    auto &textSync = *capabilities.textDocumentSync;

    textSync.openClose = true;
    textSync.change = TextDocumentSyncKind::Incremental;
    textSync.willSave = true;
    textSync.willSaveWaitUntil = false;
}